

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser_encapsulationNoChildComponentRef_Test::~Parser_encapsulationNoChildComponentRef_Test
          (Parser_encapsulationNoChildComponentRef_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, encapsulationNoChildComponentRef)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"bob\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"bob\">\n"
        "      <component_free/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    const std::vector<std::string> expectedIssues = {
        "Encapsulation in model 'model_name' has an invalid child element 'component_free'.",
        "Encapsulation in model 'model_name' specifies 'bob' as a parent component_ref but it does not have any children.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);

    EXPECT_EQ_ISSUES(expectedIssues, p);
}